

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  byte bVar1;
  uint uVar2;
  ImGuiContext *pIVar3;
  ImGuiTableSettings *p;
  ImGuiTableColumn *pIVar4;
  char *pcVar5;
  bool bVar6;
  int column_n;
  int i;
  byte *pbVar7;
  int iVar8;
  
  pIVar3 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x20) == 0) {
    if (table->SettingsOffset == -1) {
      p = TableSettingsFindByID(table->ID);
      if (p == (ImGuiTableSettings *)0x0) {
        return;
      }
      iVar8 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar3->SettingsTables,p);
      table->SettingsOffset = iVar8;
    }
    else {
      p = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = p->SaveFlags;
    table->RefScale = p->RefScale;
    pbVar7 = (byte *)((long)&p[1].RefScale + 3);
    for (iVar8 = 0; iVar8 < p->ColumnsCount; iVar8 = iVar8 + 1) {
      bVar1 = pbVar7[-3];
      i = (int)(char)bVar1;
      if ((-1 < i) && (i < table->ColumnsCount)) {
        pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,i);
        uVar2 = p->SaveFlags;
        if ((uVar2 & 1) != 0) {
          (&pIVar4->WidthStretchWeight)[(*pbVar7 & 8) == 0] = *(float *)(pbVar7 + -0xb);
          pIVar4->AutoFitQueue = '\0';
        }
        if ((uVar2 & 2) != 0) {
          bVar1 = pbVar7[-2];
        }
        pIVar4->DisplayOrder = bVar1;
        bVar6 = (bool)(*pbVar7 >> 2 & 1);
        pIVar4->IsVisibleNextFrame = bVar6;
        pIVar4->IsVisible = bVar6;
        pIVar4->SortOrder = pbVar7[-1];
        pIVar4->SortDirection = *pbVar7 & 3;
      }
      pbVar7 = pbVar7 + 0xc;
    }
    for (iVar8 = 0; iVar8 < table->ColumnsCount; iVar8 = iVar8 + 1) {
      pIVar4 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar8);
      pcVar5 = ImSpan<signed_char>::operator[]
                         (&table->DisplayOrderToIndex,(int)pIVar4->DisplayOrder);
      *pcVar5 = (char)iVar8;
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;
    //IM_ASSERT(settings->ColumnsCount == table->ColumnsCount);

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->WidthStretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImS8)column_n;
        column->IsVisible = column->IsVisibleNextFrame = column_settings->IsVisible;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // FIXME-TABLE: Need to validate .ini data
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImS8)column_n;
}